

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.h
# Opt level: O1

QByteArray * __thiscall
QByteArray::left(QByteArray *__return_storage_ptr__,QByteArray *this,qsizetype n)

{
  Data *pDVar1;
  char *pcVar2;
  long lVar3;
  
  lVar3 = (this->d).size;
  if (n < lVar3) {
    QByteArray::resize((longlong)this);
    pDVar1 = (this->d).d;
    pcVar2 = (this->d).ptr;
    (this->d).d = (Data *)0x0;
    (this->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = pcVar2;
    lVar3 = (this->d).size;
  }
  else {
    pDVar1 = (this->d).d;
    pcVar2 = (this->d).ptr;
    (this->d).d = (Data *)0x0;
    (this->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = pcVar2;
  }
  (this->d).size = 0;
  (__return_storage_ptr__->d).size = lVar3;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] QByteArray left(qsizetype n) &&
    {
        if (n >= size())
            return std::move(*this);
        return std::move(*this).first(qMax(n, 0));
    }